

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O3

void Extra_PrintHexReverse(FILE *pFile,uint *pTruth,int nVars)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  fwrite("0x",2,1,(FILE *)pFile);
  uVar1 = 1 << ((byte)nVars & 0x1f);
  uVar4 = uVar1 + 3;
  if (-1 < (int)uVar1) {
    uVar4 = uVar1;
  }
  uVar2 = (uint)(0 < (int)(uVar1 & 0x80000003));
  uVar1 = uVar2 + ((int)uVar4 >> 2);
  if (uVar1 != 0 && SCARRY4(uVar2,(int)uVar4 >> 2) == (int)uVar1 < 0) {
    bVar3 = 0;
    uVar4 = 0;
    do {
      uVar2 = pTruth[uVar4 >> 3] >> (bVar3 & 0x1f) & 0xf;
      if (uVar2 < 10) {
        fprintf((FILE *)pFile,"%d");
      }
      else {
        fputc(uVar2 + 0x37,(FILE *)pFile);
      }
      uVar4 = uVar4 + 1;
      bVar3 = bVar3 + 4;
    } while (uVar1 != uVar4);
  }
  return;
}

Assistant:

void Extra_PrintHexReverse( FILE * pFile, unsigned * pTruth, int nVars )
{
    int nMints, nDigits, Digit, k;

    // write the number into the file
    fprintf( pFile, "0x" );
    nMints  = (1 << nVars);
    nDigits = nMints / 4 + ((nMints % 4) > 0);
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = ((pTruth[k/8] >> (k * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}